

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int heap_add_entry(archive_read *a,heap_queue *heap,file_info *file,uint64_t key)

{
  int iVar1;
  void *__dest;
  ulong in_RCX;
  long in_RDX;
  long *in_RSI;
  archive *in_RDI;
  int new_size;
  file_info **new_pending_files;
  int parent;
  int hole;
  uint64_t parent_key;
  uint64_t file_key;
  int local_4c;
  int local_3c;
  
  if ((int)in_RSI[1] <= *(int *)((long)in_RSI + 0xc)) {
    local_4c = (int)in_RSI[1] << 1;
    if ((int)in_RSI[1] < 0x400) {
      local_4c = 0x400;
    }
    if (local_4c <= (int)in_RSI[1]) {
      archive_set_error(in_RDI,0xc,"Out of memory");
      return -0x1e;
    }
    __dest = malloc((long)local_4c << 3);
    if (__dest == (void *)0x0) {
      archive_set_error(in_RDI,0xc,"Out of memory");
      return -0x1e;
    }
    memcpy(__dest,(void *)*in_RSI,(long)(int)in_RSI[1] << 3);
    if (*in_RSI != 0) {
      free((void *)*in_RSI);
    }
    *in_RSI = (long)__dest;
    *(int *)(in_RSI + 1) = local_4c;
  }
  *(ulong *)(in_RDX + 0x28) = in_RCX;
  local_3c = *(int *)((long)in_RSI + 0xc);
  *(int *)((long)in_RSI + 0xc) = local_3c + 1;
  while( true ) {
    if (local_3c < 1) {
      *(long *)*in_RSI = in_RDX;
      return 0;
    }
    iVar1 = (local_3c + -1) / 2;
    if (*(ulong *)(*(long *)(*in_RSI + (long)iVar1 * 8) + 0x28) <= in_RCX) break;
    *(undefined8 *)(*in_RSI + (long)local_3c * 8) = *(undefined8 *)(*in_RSI + (long)iVar1 * 8);
    local_3c = iVar1;
  }
  *(long *)(*in_RSI + (long)local_3c * 8) = in_RDX;
  return 0;
}

Assistant:

static int
heap_add_entry(struct archive_read *a, struct heap_queue *heap,
    struct file_info *file, uint64_t key)
{
	uint64_t file_key, parent_key;
	int hole, parent;

	/* Expand our pending files list as necessary. */
	if (heap->used >= heap->allocated) {
		struct file_info **new_pending_files;
		int new_size = heap->allocated * 2;

		if (heap->allocated < 1024)
			new_size = 1024;
		/* Overflow might keep us from growing the list. */
		if (new_size <= heap->allocated) {
			archive_set_error(&a->archive,
			    ENOMEM, "Out of memory");
			return (ARCHIVE_FATAL);
		}
		new_pending_files = (struct file_info **)
		    malloc(new_size * sizeof(new_pending_files[0]));
		if (new_pending_files == NULL) {
			archive_set_error(&a->archive,
			    ENOMEM, "Out of memory");
			return (ARCHIVE_FATAL);
		}
		memcpy(new_pending_files, heap->files,
		    heap->allocated * sizeof(new_pending_files[0]));
		if (heap->files != NULL)
			free(heap->files);
		heap->files = new_pending_files;
		heap->allocated = new_size;
	}

	file_key = file->key = key;

	/*
	 * Start with hole at end, walk it up tree to find insertion point.
	 */
	hole = heap->used++;
	while (hole > 0) {
		parent = (hole - 1)/2;
		parent_key = heap->files[parent]->key;
		if (file_key >= parent_key) {
			heap->files[hole] = file;
			return (ARCHIVE_OK);
		}
		/* Move parent into hole <==> move hole up tree. */
		heap->files[hole] = heap->files[parent];
		hole = parent;
	}
	heap->files[0] = file;

	return (ARCHIVE_OK);
}